

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O3

void __thiscall csv::CSVReader::~CSVReader(CSVReader *this)

{
  ThreadSafeDeque<csv::CSVRow> *pTVar1;
  IBasicCSVParser *pIVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar3;
  
  if ((this->read_csv_worker)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->read_csv_worker)._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  pTVar1 = (this->records)._M_t.
           super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
           .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
           _M_head_impl;
  if (pTVar1 != (ThreadSafeDeque<csv::CSVRow> *)0x0) {
    std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::~deque(&pTVar1->data);
    std::condition_variable::~condition_variable(&pTVar1->_cond);
    operator_delete(pTVar1,0xb8);
  }
  (this->records)._M_t.
  super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
  .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>._M_head_impl =
       (ThreadSafeDeque<csv::CSVRow> *)0x0;
  pIVar2 = (this->parser)._M_t.
           super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
           ._M_t.
           super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
           .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl;
  if (pIVar2 != (IBasicCSVParser *)0x0) {
    (*pIVar2->_vptr_IBasicCSVParser[1])();
  }
  (this->parser)._M_t.
  super___uniq_ptr_impl<csv::internals::IBasicCSVParser,_std::default_delete<csv::internals::IBasicCSVParser>_>
  ._M_t.
  super__Tuple_impl<0UL,_csv::internals::IBasicCSVParser_*,_std::default_delete<csv::internals::IBasicCSVParser>_>
  .super__Head_base<0UL,_csv::internals::IBasicCSVParser_*,_false>._M_head_impl =
       (IBasicCSVParser *)0x0;
  this_00 = (this->col_names).
            super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->_format).col_names);
  pcVar3 = (this->_format).trim_chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->_format).trim_chars.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  pcVar3 = (this->_format).possible_delimiters.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->_format).possible_delimiters.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
    return;
  }
  return;
}

Assistant:

~CSVReader() {
            if (this->read_csv_worker.joinable()) {
                this->read_csv_worker.join();
            }
        }